

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

_Bool borg_flow_kill(_Bool viewable,wchar_t nearness)

{
  wchar_t y_00;
  loc grid1;
  bool bVar1;
  bool bVar2;
  chunk_conflict *c;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  borg_grid *pbVar6;
  loc grid2;
  borg_kill *pbVar7;
  loc_conflict grid;
  int iVar8;
  int local_80;
  int local_7c;
  int local_78;
  wchar_t d;
  wchar_t ay;
  wchar_t ax;
  wchar_t y9;
  wchar_t x9;
  borg_kill *kill;
  borg_grid *ag;
  int iStack_38;
  _Bool skip_monster;
  wchar_t hall_walls;
  wchar_t hall_x;
  wchar_t hall_y;
  wchar_t wStack_28;
  _Bool borg_in_hall;
  wchar_t b_stair;
  wchar_t b_j;
  wchar_t j;
  wchar_t p;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  wchar_t nearness_local;
  _Bool viewable_local;
  
  wStack_28 = L'\xffffffff';
  hall_y = L'\xffffffff';
  bVar1 = false;
  ag._4_4_ = 0;
  bVar2 = false;
  if (borg_kills_cnt == 0) {
    i._3_1_ = false;
  }
  else if (((borg.trait[0x69] == 0) && (borg.trait[0x23] < 0x14)) && (borg_cfg[0x18] == 0)) {
    i._3_1_ = false;
  }
  else {
    if ((borg.trait[0x19] == 1) || (borg.trait[0x19] == 4)) {
      iVar8 = 0x19;
      if (borg.trait[0x69] != 0) {
        iVar8 = 0x23;
      }
      if (borg.trait[0x23] < iVar8) {
        return false;
      }
    }
    if (((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) && (borg.trait[0x27] != 0)) {
      if (borg_morgoth_position) {
        i._3_1_ = false;
      }
      else {
        borg_temp_n = 0;
        for (iStack_38 = -1; iStack_38 < 2; iStack_38 = iStack_38 + 1) {
          for (hall_walls = L'\xffffffff'; hall_walls < L'\x02'; hall_walls = hall_walls + L'\x01')
          {
            pbVar6 = borg_grids[hall_walls + borg.c.y] + (iStack_38 + borg.c.x);
            if (((pbVar6->glyph & 1U) != 0) || ((0x10 < pbVar6->feat && (pbVar6->feat < 0x17)))) {
              ag._4_4_ = ag._4_4_ + 1;
            }
            if (4 < ag._4_4_) {
              bVar1 = true;
            }
          }
        }
        for (y = L'\0'; y < track_less.num; y = y + L'\x01') {
          grid2 = loc(track_less.x[y],track_less.y[y]);
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar4 = distance(grid1,grid2);
          if (wStack_28 < wVar4) {
            hall_y = y;
            wStack_28 = wVar4;
          }
        }
        for (y = L'\x01'; y < borg_kills_nxt; y = y + L'\x01') {
          pbVar7 = borg_kills + y;
          local_78 = (pbVar7->pos).x;
          local_7c = (pbVar7->pos).y;
          if (pbVar7->r_idx != 0) {
            if (borg.c.x < local_78) {
              local_78 = local_78 - borg.c.x;
            }
            else {
              local_78 = borg.c.x - local_78;
            }
            if (borg.c.y < local_7c) {
              local_7c = local_7c - borg.c.y;
            }
            else {
              local_7c = borg.c.y - local_7c;
            }
            if (local_78 < local_7c) {
              local_80 = local_7c;
            }
            else {
              local_80 = local_78;
            }
            if ((((local_80 != 1) || ((borg.trait[0x71] == 0 && (borg.trait[0xba] == 0)))) &&
                (((borg.goal.ignoring & 1U) == 0 ||
                 ((borg.trait[0x71] != 0 ||
                  (_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x11,
                                        "r_info[kill->r_idx].flags","RF_MULTIPLY"), !_Var3)))))) &&
               (((((9 < borg.trait[0x24] ||
                   (_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x15,
                                         "r_info[kill->r_idx].flags","RF_NEVER_MOVE"), !_Var3)) &&
                  ((scaryguy_on_level & 1U) == 0)) &&
                 ((9 < borg.trait[0x23] ||
                  (_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x11,
                                        "r_info[kill->r_idx].flags","RF_MULTIPLY"), !_Var3)))) &&
                ((_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,1,"r_info[kill->r_idx].flags"
                                       ,"RF_UNIQUE"), !_Var3 ||
                 ((borg.trait[0x69] != 0 || (4 < borg.trait[0x23])))))))) {
              wVar4 = (pbVar7->pos).x;
              y_00 = (pbVar7->pos).y;
              if (((!viewable) || ((borg_grids[y_00][wVar4].info & 0x20) != 0)) &&
                 (((((wVar5 = borg_danger(y_00,wVar4,L'\x01',true,false), borg.trait[0x23] < 0x1a ||
                     (_Var3 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE"), _Var3))
                    || (wVar5 <= (int)avoidance / 2)) &&
                   ((0xf < borg.trait[0x23] || (wVar5 <= (int)avoidance / 3)))) &&
                  (((hall_y == L'\xffffffff' ||
                    ((9 < borg.trait[0x23] ||
                     (wVar5 = borg_distance(track_less.y[hall_y],track_less.x[hall_y],y_00,wVar4),
                     borg.trait[0x23] * 5 + L'\t' < wStack_28)))) ||
                   (wVar5 < borg.trait[0x23] * 5 + L'\t')))))) {
                if ((bVar1) &&
                   (_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,5,
                                         "r_info[kill->r_idx].flags","RF_GROUP_AI"), _Var3)) {
                  for (iStack_38 = -1; iStack_38 < 2; iStack_38 = iStack_38 + 1) {
                    for (hall_walls = L'\xffffffff'; c = cave, hall_walls < L'\x02';
                        hall_walls = hall_walls + L'\x01') {
                      grid = (loc_conflict)loc(iStack_38 + wVar4,hall_walls + y_00);
                      _Var3 = square_in_bounds_fully((chunk *)c,grid);
                      if (_Var3) {
                        pbVar6 = borg_grids[hall_walls + y_00] + (iStack_38 + wVar4);
                        if (((pbVar6->glyph & 1U) != 0) ||
                           ((0x10 < pbVar6->feat && (pbVar6->feat < 0x17)))) {
                          ag._4_4_ = ag._4_4_ + 1;
                        }
                        if (ag._4_4_ < 4) {
                          bVar2 = true;
                        }
                      }
                    }
                  }
                }
                if (((local_80 == 2) && (pbVar7->ranged_attack == '\0')) &&
                   (_Var3 = flag_has_dbg(r_info[pbVar7->r_idx].flags,0xb,0x15,
                                         "r_info[kill->r_idx].flags","RF_NEVER_MOVE"), !_Var3)) {
                  bVar2 = true;
                }
                if ((!bVar2) && (_Var3 = borg_flow_far_from_stairs(wVar4,y_00,hall_y), !_Var3)) {
                  borg_temp_x[borg_temp_n] = (uint8_t)wVar4;
                  borg_temp_y[borg_temp_n] = (uint8_t)y_00;
                  borg_temp_n = borg_temp_n + 1;
                }
              }
            }
          }
        }
        if (borg_temp_n == 0) {
          i._3_1_ = false;
        }
        else {
          borg_flow_clear();
          for (y = L'\0'; y < borg_temp_n; y = y + L'\x01') {
            borg_flow_enqueue_grid((uint)borg_temp_y[y],(uint)borg_temp_x[y]);
          }
          borg_flow_spread(nearness,true,(_Bool)((viewable ^ 0xffU) & 1),false,L'\xffffffff',false);
          _Var3 = borg_flow_commit("kill",L'\x01');
          if (_Var3) {
            _Var3 = borg_flow_old(L'\x01');
            if (_Var3) {
              i._3_1_ = true;
            }
            else {
              i._3_1_ = false;
            }
          }
          else {
            i._3_1_ = false;
          }
        }
      }
    }
    else {
      i._3_1_ = false;
    }
  }
  return i._3_1_;
}

Assistant:

bool borg_flow_kill(bool viewable, int nearness)
{
    int i, x, y, p, j, b_j = -1;
    int b_stair       = -1;

    bool borg_in_hall = false;
    int  hall_y, hall_x, hall_walls = 0;
    bool skip_monster = false;

    borg_grid *ag;

    /* Efficiency -- Nothing to kill */
    if (!borg_kills_cnt)
        return false;

    /* Don't chase down town monsters when you are just starting out */
    if (borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 20
        && !borg_cfg[BORG_MONEY_SCUM_AMOUNT])
        return false;

    /* YOU ARE NOT A WARRIOR!! DON'T ACT LIKE ONE!! */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        && borg.trait[BI_CLEVEL] < (borg.trait[BI_CDEPTH] ? 35 : 25))
        return false;

    /* Not if Weak from hunger or no food */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK]
        || borg.trait[BI_FOOD] == 0)
        return false;

    /* Not if sitting in a sea of runes */
    if (borg_morgoth_position)
        return false;

    /* Nothing found */
    borg_temp_n = 0;

    /* check to see if in a hall, used later */
    for (hall_x = -1; hall_x <= 1; hall_x++) {
        for (hall_y = -1; hall_y <= 1; hall_y++) {
            /* Acquire location */
            x  = hall_x + borg.c.x;
            y  = hall_y + borg.c.y;

            ag = &borg_grids[y][x];

            /* track walls */
            if ((ag->glyph)
                || ((ag->feat >= FEAT_MAGMA) && (ag->feat <= FEAT_PERM))) {
                hall_walls++;
            }

            /* addem up */
            if (hall_walls >= 5)
                borg_in_hall = true;
        }
    }

    /* Check distance away from stairs, used later */

    /* Check for an existing "up stairs" */
    for (i = 0; i < track_less.num; i++) {
        x = track_less.x[i];
        y = track_less.y[i];

        /* How far is the nearest up stairs */
        j = distance(borg.c, loc(x, y));

        /* skip the closer ones */
        if (b_j >= j)
            continue;

        /* track it */
        b_j     = j;
        b_stair = i;
    }

    /* Scan the monster list */
    for (i = 1; i < borg_kills_nxt; i++) {
        borg_kill *kill = &borg_kills[i];
        int        x9   = kill->pos.x;
        int        y9   = kill->pos.y;
        int        ax, ay, d;

        /* Skip dead monsters */
        if (!kill->r_idx)
            continue;

        /* Distance components */
        ax = (x9 > borg.c.x) ? (x9 - borg.c.x) : (borg.c.x - x9);
        ay = (y9 > borg.c.y) ? (y9 - borg.c.y) : (borg.c.y - y9);

        /* Distance */
        d = MAX(ax, ay);

        /* don't bother flowing to an adjacent monster when I am afraid */
        if (d == 1 && (borg.trait[BI_ISAFRAID] || borg.trait[BI_CRSFEAR]))
            continue;

        /* Ignore multiplying monsters */
        if (borg.goal.ignoring && !borg.trait[BI_ISAFRAID]
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Ignore molds when low level */
        if (borg.trait[BI_MAXCLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_NEVER_MOVE)))
            continue;

        /* Avoid flowing to a fight if a scary guy is on the level */
        if (scaryguy_on_level)
            continue;

        /* Avoid multiplying monsters when low level */
        if (borg.trait[BI_CLEVEL] < 10
            && (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY)))
            continue;

        /* Hack -- ignore Maggot until later.  Player will chase Maggot
         * down all across the screen waking up all the monsters.  Then
         * he is stuck in a compromised situation.
         */
        if ((rf_has(r_info[kill->r_idx].flags, RF_UNIQUE))
            && borg.trait[BI_CDEPTH] == 0 && borg.trait[BI_CLEVEL] < 5)
            continue;

        /* Access the location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Require line of sight if requested */
        if (viewable && !(ag->info & BORG_VIEW))
            continue;

        /* Calculate danger */
        p = borg_danger(y, x, 1, true, false);

        /* Hack -- Skip "deadly" monsters unless uniques*/
        if (borg.trait[BI_CLEVEL] > 25 && (!rf_has(r_info->flags, RF_UNIQUE))
            && p > avoidance / 2)
            continue;
        if (borg.trait[BI_CLEVEL] <= 15 && p > avoidance / 3)
            continue;

        /* Skip ones that make me wander too far */
        if (b_stair != -1 && borg.trait[BI_CLEVEL] < 10) {
            /* Check the distance of this monster to the stair */
            j = borg_distance(
                track_less.y[b_stair], track_less.x[b_stair], y, x);
            /* skip far away monsters while I am close to stair */
            if (b_j <= borg.trait[BI_CLEVEL] * 5 + 9
                && j >= borg.trait[BI_CLEVEL] * 5 + 9)
                continue;
        }

        /* Hack -- Avoid getting surrounded */
        if (borg_in_hall && (rf_has(r_info[kill->r_idx].flags, RF_GROUP_AI))) {
            /* check to see if monster is in a hall, */
            for (hall_x = -1; hall_x <= 1; hall_x++) {
                for (hall_y = -1; hall_y <= 1; hall_y++) {
                    if (!square_in_bounds_fully(
                            cave, loc(hall_x + x, hall_y + y)))
                        continue;
                    ag = &borg_grids[hall_y + y][hall_x + x];

                    /* track walls */
                    if ((ag->glyph)
                        || ((ag->feat >= FEAT_MAGMA)
                            && (ag->feat <= FEAT_PERM))) {
                        hall_walls++;
                    }

                    /* we want the monster to be in a hall also
                     *
                     *  ########################
                     *  ############      S  ###
                     *  #         @'     SSS ###
                     *  # ##########       SS###
                     *  # #        #       Ss###
                     *  # #        ###### ######
                     *  # #             # #
                     * Currently, we would like the borg to avoid
                     * flowing to a situation like the one above.
                     * We would like him to stay in the hall and
                     * attack from a distance.  One problem is the
                     * lower case 's' in the corner, He will show
                     * up as being in a corner, and the borg may
                     * flow to it.  Let's hope that is a rare case.
                     *
                     * The borg might flow to the 'dark' south exit
                     * of the room.  This would be dangerous for
                     * him as well.
                     */
                    /* add 'em up */
                    if (hall_walls < 4) {
                        /* This monster is not in a hallway.
                         * It may not be safe to fight.
                         */
                        skip_monster = true;
                    }
                }
            }
        }

        /* Skip this one if it is just 2 grids from me and it can attack me as
         * soon as I move 1 grid closer to it.  Note that some monsters are
         * faster than me and it could still cover the 1 grid and hit me. I'll
         * fix it (based on my speed) later XXX
         */
        if (d == 2 && /* Spacing is important */
            (!(kill->ranged_attack)) && /* Ranged Attacks, don't rest. */
            (!(rf_has(r_info[kill->r_idx].flags,
                RF_NEVER_MOVE)))) /* Skip monsters that dont chase */
        {
            skip_monster = true;
        }

        /* skip certain ones */
        if (skip_monster)
            continue;

        /* don't go too far from the stairs */
        if (borg_flow_far_from_stairs(x, y, b_stair))
            continue;

        /* Careful -- Remember it */
        borg_temp_x[borg_temp_n] = x;
        borg_temp_y[borg_temp_n] = y;
        borg_temp_n++;
    }

    /* Nothing to kill */
    if (!borg_temp_n)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Look for something to kill */
    for (i = 0; i < borg_temp_n; i++) {
        /* Enqueue the grid */
        borg_flow_enqueue_grid(borg_temp_y[i], borg_temp_x[i]);
    }

    /* Spread the flow */
    /* if we are not flowing toward monsters that we can see, make sure they */
    /* are at least easily reachable.  The second flag is whether or not */
    /* to avoid unknown squares.  This was for performance when we have ESP. */
    borg_flow_spread(nearness, true, !viewable, false, -1, false);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("kill", GOAL_KILL))
        return false;

    /* Take one step */
    if (!borg_flow_old(GOAL_KILL))
        return false;

    /* Success */
    return true;
}